

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasuEigen.cpp
# Opt level: O3

int main(void)

{
  pointer pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ostream *poVar4;
  int i;
  long lVar5;
  int iVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double r;
  double y;
  double x;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  a;
  vector<double,_std::allocator<double>_> local_68;
  double local_50;
  double local_48;
  double local_40;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_38;
  long lVar10;
  
  local_38.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar6 = 9;
  do {
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)operator_new(0x48);
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + 9;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[6] = 0.0;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[7] = 0.0;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[4] = 0.0;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[5] = 0.0;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = 0.0;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[3] = 0.0;
    *local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = 0.0;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = 0.0;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[8] = 0.0;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    std::
    vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
    ::emplace_back<std::vector<double,std::allocator<double>>>
              ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                *)&local_38,&local_68);
    if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    auVar3 = _DAT_00103020;
    auVar2 = _DAT_00103010;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  iVar6 = 1;
  lVar5 = 0;
  do {
    pdVar1 = local_38.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar5].
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    lVar7 = 0;
    auVar9 = auVar2;
    do {
      if (SUB164(auVar9 ^ auVar3,4) == -0x80000000 && SUB164(auVar9 ^ auVar3,0) < -0x7ffffff7) {
        pdVar1[lVar7] = (double)((int)lVar5 + (int)lVar7);
        pdVar1[lVar7 + 1] = (double)(iVar6 + (int)lVar7);
      }
      lVar7 = lVar7 + 2;
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
    } while (lVar7 != 10);
    lVar5 = lVar5 + 1;
    iVar6 = iVar6 + 1;
  } while (lVar5 != 9);
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x48);
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(*(undefined1 (*) [16])
                         ((long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start + 0x40) + 8);
  *(undefined8 *)
   *(undefined1 (*) [16])
    ((long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + 0x40) = 0;
  *(undefined1 (*) [16])
   ((long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start + 0x30) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   ((long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start + 0x20) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   ((long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start + 0x10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = (undefined1  [16])0x0;
  local_50 = 0.0;
  local_40 = 0.1;
  local_48 = 0.7;
  iVar6 = 1000000;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  lVar5 = std::chrono::_V2::system_clock::now();
  do {
    dVar8 = Clenshaw2D<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,std::vector<double,std::allocator<double>>>
                      (&local_38,local_40,local_48,&local_68);
    local_50 = dVar8 + local_50;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  lVar7 = std::chrono::_V2::system_clock::now();
  poVar4 = std::ostream::_M_insert<double>
                     ((((double)(lVar7 - lVar5) / 1000000000.0) / 1000000.0) * 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," us/call. value:",0x10);
  poVar4 = std::ostream::_M_insert<double>(local_50 / 1000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if ((undefined1 (*) [16])
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (undefined1 (*) [16])0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Dynamic:",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  test_Eigen<_1,_1>(8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Static:",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  test_Eigen<9,9>(8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_38);
  return 0;
}

Assistant:

int main(){
    std::vector<std::vector<double>> a;
    const int M = 8;
    for (auto i = 0; i <= M; ++i){
        a.push_back(std::vector<double>(M+1, 0.0)); // One would normally use Eigen here, but the challenge is to use only standard library elements...
    }
    {
        for (auto i = 0; i < M + 1; ++i) {
            for (auto j = 0; j < M + 1; ++j) {
                a[i][j] = i + j;
            }
        }
        std::vector<double> b(M+1, 0.0);
        int N = 1000 * 1000;
        volatile auto r = 0.0, x = 0.1, y = 0.7;
        auto startTime = std::chrono::system_clock::now();
        for (int i = 0; i < N; ++i) {
            auto v = Clenshaw2D(a, x, y, b);
            r += v;
        }
        auto endTime = std::chrono::system_clock::now();
        auto elap_us = std::chrono::duration<double>(endTime - startTime).count() / N * 1e6;
        std::cout << elap_us << " us/call. value:" << (r / N) << std::endl;
    }
    std::cout  << "Dynamic:" << std::endl;
    test_Eigen<Eigen::Dynamic, Eigen::Dynamic>(M);

    std::cout  << "Static:" << std::endl;
    test_Eigen<M+1, M+1>(M);
}